

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

token_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::scan_number(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *this)

{
  int iVar1;
  char cVar2;
  int_type iVar3;
  int *piVar4;
  ulonglong uVar5;
  char *pcVar6;
  long lVar7;
  token_type tVar8;
  double dVar9;
  char *endptr;
  char *local_28;
  
  reset(this);
  iVar1 = this->current;
  cVar2 = (char)this;
  if (iVar1 - 0x31U < 9) {
    tVar8 = value_unsigned;
LAB_001499bf:
    std::__cxx11::string::push_back(cVar2 + '8');
    while (iVar3 = get(this), iVar3 - 0x30U < 10) {
      std::__cxx11::string::push_back(cVar2 + '8');
    }
    if (iVar3 == 0x2e) {
LAB_00149b57:
      std::__cxx11::string::push_back(cVar2 + '8');
      iVar3 = get(this);
      if (9 < iVar3 - 0x30U) {
        pcVar6 = "invalid number; expected digit after \'.\'";
        goto LAB_00149c43;
      }
      do {
        std::__cxx11::string::push_back(cVar2 + '8');
        iVar3 = get(this);
      } while (iVar3 - 0x30U < 10);
      if ((iVar3 != 0x65) && (iVar3 != 0x45)) {
        tVar8 = value_float;
        goto LAB_00149a07;
      }
    }
    else if ((iVar3 != 0x45) && (iVar3 != 0x65)) goto LAB_00149a07;
LAB_00149bab:
    std::__cxx11::string::push_back(cVar2 + '8');
    iVar3 = get(this);
    if (9 < iVar3 - 0x30U) {
      if ((iVar3 != 0x2d) && (iVar3 != 0x2b)) {
        pcVar6 = "invalid number; expected \'+\', \'-\', or digit after exponent";
LAB_00149c43:
        this->error_message = pcVar6;
        return parse_error;
      }
      std::__cxx11::string::push_back(cVar2 + '8');
      iVar3 = get(this);
      if (9 < iVar3 - 0x30U) {
        pcVar6 = "invalid number; expected digit after exponent sign";
        goto LAB_00149c43;
      }
    }
    std::__cxx11::string::push_back(cVar2 + '8');
    iVar3 = get(this);
    tVar8 = value_float;
    if (iVar3 - 0x30U < 10) {
      lexer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
      ::scan_number();
    }
  }
  else {
    if (iVar1 == 0x30) {
      std::__cxx11::string::push_back(cVar2 + '8');
      tVar8 = value_unsigned;
    }
    else {
      if (iVar1 != 0x2d) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/json.hpp"
                      ,0x938,
                      "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_number() [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      std::__cxx11::string::push_back(cVar2 + '8');
      iVar3 = get(this);
      if (iVar3 - 0x31U < 9) {
        tVar8 = value_integer;
        goto LAB_001499bf;
      }
      if (iVar3 != 0x30) {
        pcVar6 = "invalid number; expected digit after \'-\'";
        goto LAB_00149c43;
      }
      std::__cxx11::string::push_back(cVar2 + '8');
      tVar8 = value_integer;
    }
    iVar3 = get(this);
    if (iVar3 == 0x2e) goto LAB_00149b57;
    if ((iVar3 == 0x65) || (iVar3 == 0x45)) goto LAB_00149bab;
  }
LAB_00149a07:
  unget(this);
  local_28 = (pointer)0x0;
  piVar4 = __errno_location();
  *piVar4 = 0;
  if (tVar8 == value_integer) {
    uVar5 = strtoll((this->yytext)._M_dataplus._M_p,&local_28,10);
    if (local_28 != (this->yytext)._M_dataplus._M_p + (this->yytext)._M_string_length) {
      __assert_fail("endptr == yytext.data() + yytext.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/json.hpp"
                    ,0xa40,
                    "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_number() [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    if (*piVar4 == 0) {
      lVar7 = 0x60;
LAB_00149ada:
      *(ulonglong *)
       ((long)&(this->ia).
               super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr + lVar7) = uVar5;
      return tVar8;
    }
  }
  else if (tVar8 == value_unsigned) {
    uVar5 = strtoull((this->yytext)._M_dataplus._M_p,&local_28,10);
    if (local_28 != (this->yytext)._M_dataplus._M_p + (this->yytext)._M_string_length) {
      __assert_fail("endptr == yytext.data() + yytext.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/json.hpp"
                    ,0xa30,
                    "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_number() [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    if (*piVar4 == 0) {
      lVar7 = 0x68;
      goto LAB_00149ada;
    }
  }
  dVar9 = strtod((this->yytext)._M_dataplus._M_p,&local_28);
  this->value_float = dVar9;
  if (local_28 == (this->yytext)._M_dataplus._M_p + (this->yytext)._M_string_length) {
    return value_float;
  }
  __assert_fail("endptr == yytext.data() + yytext.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/json.hpp",
                0xa51,
                "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_number() [BasicJsonType = nlohmann::basic_json<>]"
               );
}

Assistant:

token_type scan_number()
    {
        // reset yytext to store the number's bytes
        reset();

        // the type of the parsed number; initially set to unsigned; will be
        // changed if minus sign, decimal point or exponent is read
        token_type number_type = token_type::value_unsigned;

        // state (init): we just found out we need to scan a number
        switch (current)
        {
            case '-':
            {
                add(current);
                goto scan_number_minus;
            }

            case '0':
            {
                add(current);
                goto scan_number_zero;
            }

            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            default:
            {
                // all other characters are rejected outside scan_number()
                assert(false); // LCOV_EXCL_LINE
            }
        }

scan_number_minus:
        // state: we just parsed a leading minus sign
        number_type = token_type::value_integer;
        switch (get())
        {
            case '0':
            {
                add(current);
                goto scan_number_zero;
            }

            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            default:
            {
                error_message = "invalid number; expected digit after '-'";
                return token_type::parse_error;
            }
        }

scan_number_zero:
        // state: we just parse a zero (maybe with a leading minus sign)
        switch (get())
        {
            case '.':
            {
                add(decimal_point_char);
                goto scan_number_decimal1;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_any1:
        // state: we just parsed a number 0-9 (maybe with a leading minus sign)
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            case '.':
            {
                add(decimal_point_char);
                goto scan_number_decimal1;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_decimal1:
        // state: we just parsed a decimal point
        number_type = token_type::value_float;
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_decimal2;
            }

            default:
            {
                error_message = "invalid number; expected digit after '.'";
                return token_type::parse_error;
            }
        }

scan_number_decimal2:
        // we just parsed at least one number after a decimal point
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_decimal2;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_exponent:
        // we just parsed an exponent
        number_type = token_type::value_float;
        switch (get())
        {
            case '+':
            case '-':
            {
                add(current);
                goto scan_number_sign;
            }

            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
            {
                error_message =
                    "invalid number; expected '+', '-', or digit after exponent";
                return token_type::parse_error;
            }
        }

scan_number_sign:
        // we just parsed an exponent sign
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
            {
                error_message = "invalid number; expected digit after exponent sign";
                return token_type::parse_error;
            }
        }

scan_number_any2:
        // we just parsed a number after the exponent or exponent sign
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
                goto scan_number_done;
        }

scan_number_done:
        // unget the character after the number (we only read it to know that
        // we are done scanning a number)
        unget();

        char* endptr = nullptr;
        errno = 0;

        // try to parse integers first and fall back to floats
        if (number_type == token_type::value_unsigned)
        {
            const auto x = std::strtoull(yytext.data(), &endptr, 10);

            // we checked the number format before
            assert(endptr == yytext.data() + yytext.size());

            if (errno == 0)
            {
                value_unsigned = static_cast<number_unsigned_t>(x);
                if (value_unsigned == x)
                {
                    return token_type::value_unsigned;
                }
            }
        }
        else if (number_type == token_type::value_integer)
        {
            const auto x = std::strtoll(yytext.data(), &endptr, 10);

            // we checked the number format before
            assert(endptr == yytext.data() + yytext.size());

            if (errno == 0)
            {
                value_integer = static_cast<number_integer_t>(x);
                if (value_integer == x)
                {
                    return token_type::value_integer;
                }
            }
        }

        // this code is reached if we parse a floating-point number or if an
        // integer conversion above failed
        strtof(value_float, yytext.data(), &endptr);

        // we checked the number format before
        assert(endptr == yytext.data() + yytext.size());

        return token_type::value_float;
    }